

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckArmorType
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  AInventory *pAVar5;
  uint val;
  char *pcVar6;
  AActor *this;
  FName local_34;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003da7bc;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003da7ac:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003da7bc:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x4d2,
                  "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003da706;
    bVar3 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003da7bc;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003da7ac;
LAB_003da706:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      iVar1 = param[1].field_0.i;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003da74e;
        pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003da74e:
          iVar2 = param[2].field_0.i;
          pAVar5 = AActor::FindInventory(this,&local_34);
          iVar4 = 0;
          val = 0;
          if ((pAVar5 != (AInventory *)0x0) &&
             (*(int *)((long)&pAVar5[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) ==
              iVar1)) {
            val = (uint)(iVar2 <= pAVar5->Amount);
          }
          if (0 < numret) {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x4d8,
                            "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,val);
            iVar4 = 1;
          }
          return iVar4;
        }
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x4d4,
                    "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar6 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x4d3,
                "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckArmorType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME	 (type);
	PARAM_INT_DEF(amount);

	ABasicArmor *armor = (ABasicArmor *)self->FindInventory(NAME_BasicArmor);

	ACTION_RETURN_BOOL(armor && armor->ArmorType == type && armor->Amount >= amount);
}